

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O2

TransactionController * __thiscall
cfd::api::TransactionApi::AddMultisigSign
          (TransactionController *__return_storage_ptr__,TransactionApi *this,string *tx_hex,
          TxInReference *txin,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          AddressType address_type,Script *witness_script,Script redeem_script,bool clear_stack)

{
  uint32_t vout;
  Txid TStack_88;
  Script local_68;
  
  core::Txid::Txid(&TStack_88,&(txin->super_AbstractTxInReference).txid_);
  vout = (txin->super_AbstractTxInReference).vout_;
  core::Script::Script(&local_68,(Script *)redeem_script._vptr_Script);
  AddMultisigSign(__return_storage_ptr__,(TransactionApi *)redeem_script._vptr_Script,tx_hex,
                  &TStack_88,vout,sign_list,address_type,witness_script,&local_68,
                  redeem_script.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_);
  core::Script::~Script(&local_68);
  core::Txid::~Txid(&TStack_88);
  return __return_storage_ptr__;
}

Assistant:

TransactionController TransactionApi::AddMultisigSign(
    const std::string& tx_hex, const TxInReference& txin,
    const std::vector<SignParameter>& sign_list, AddressType address_type,
    const Script& witness_script, const Script redeem_script,
    bool clear_stack) {
  return AddMultisigSign(
      tx_hex, txin.GetTxid(), txin.GetVout(), sign_list, address_type,
      witness_script, redeem_script, clear_stack);
}